

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorrenderer.cpp
# Opt level: O3

void __thiscall EditorRenderer::~EditorRenderer(EditorRenderer *this)

{
  Renderer *this_00;
  undefined1 auVar1 [8];
  pointer ppEVar2;
  ulong uVar3;
  undefined1 local_48 [8];
  vector<Entity_*,_std::allocator<Entity_*>_> entities;
  vector<Light_*,_std::allocator<Light_*>_> lights;
  
  (this->super_Fl_Gl_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__EditorRenderer_00254570;
  std::vector<Entity_*,_std::allocator<Entity_*>_>::vector
            ((vector<Entity_*,_std::allocator<Entity_*>_> *)local_48,&this->editorScene->entities);
  if ((undefined1  [8])
      entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_start != local_48) {
    uVar3 = 0;
    auVar1 = local_48;
    ppEVar2 = entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (*(pointer)((long)auVar1 + uVar3 * 8) != (Entity *)0x0) {
        (*(*(pointer)((long)auVar1 + uVar3 * 8))->_vptr_Entity[1])();
        auVar1 = local_48;
        ppEVar2 = entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)ppEVar2 - (long)auVar1 >> 3));
  }
  std::vector<Light_*,_std::allocator<Light_*>_>::vector
            ((vector<Light_*,_std::allocator<Light_*>_> *)
             &entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->editorScene->lights);
  if (lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
    uVar3 = 0;
    ppEVar2 = entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    do {
      if (ppEVar2[uVar3] != (Entity *)0x0) {
        (*ppEVar2[uVar3]->_vptr_Entity[1])();
        ppEVar2 = entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)ppEVar2 >> 3));
  }
  if (this->editorScene != (Scene *)0x0) {
    (*this->editorScene->_vptr_Scene[1])();
  }
  this_00 = this->engineRenderer;
  if (this_00 != (Renderer *)0x0) {
    Renderer::~Renderer(this_00);
  }
  operator_delete(this_00);
  if (this->unlitMaterial != (Material *)0x0) {
    (*this->unlitMaterial->_vptr_Material[1])();
  }
  if (this->unlitShader != (Shader *)0x0) {
    (*this->unlitShader->_vptr_Shader[1])();
  }
  ManyMouse_Quit();
  if (entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48);
  }
  Fl_Gl_Window::~Fl_Gl_Window(&this->super_Fl_Gl_Window);
  return;
}

Assistant:

EditorRenderer::~EditorRenderer()
{
	std::vector<Entity*> entities = editorScene->getEntities();

	for (int i = 0; i < entities.size(); i++)
	{
		delete entities[i];
	}

	std::vector<Light*> lights = editorScene->getLights();

	for (int i = 0; i < lights.size(); i++)
	{
		delete lights[i];
	}

	delete editorScene;
	delete engineRenderer;
	delete unlitMaterial;
	delete unlitShader;
	ManyMouse_Quit();
}